

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmArgumentParser.cxx
# Opt level: O2

void __thiscall
ArgumentParser::Instance::Consume
          (Instance *this,string_view arg,void *result,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *unparsedArguments,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *keywordsMissingValue)

{
  string *this_00;
  const_iterator cVar1;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *this_01;
  allocator<char> local_59;
  basic_string_view<char,_std::char_traits<char>_> local_58;
  string local_48 [32];
  
  local_58._M_str = arg._M_str;
  local_58._M_len = arg._M_len;
  cVar1 = ActionMap::Find(this->Bindings,arg);
  if (cVar1._M_current ==
      (this->Bindings->
      super_vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>_>_>
      ).
      super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    this_00 = this->CurrentString;
    if (this_00 == (string *)0x0) {
      this_01 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                this->CurrentList;
      if ((this_01 != (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)0x0) ||
         (this_01 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                    unparsedArguments,
         unparsedArguments !=
         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)0x0)) {
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::basic_string_view<char,std::char_traits<char>>&>(this_01,&local_58);
      }
    }
    else {
      std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                (local_48,&local_58,&local_59);
      std::__cxx11::string::operator=((string *)this_00,local_48);
      std::__cxx11::string::~string(local_48);
      this->CurrentString = (string *)0x0;
      this->CurrentList = (StringList *)0x0;
    }
    if (this->ExpectValue == true) {
      if (keywordsMissingValue !=
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)0x0) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::pop_back(keywordsMissingValue);
      }
      this->ExpectValue = false;
    }
  }
  else {
    std::function<void_(ArgumentParser::Instance_&,_void_*)>::operator()
              (&(cVar1._M_current)->second,this,result);
    if ((keywordsMissingValue !=
         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)0x0) && (this->ExpectValue != false)) {
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::basic_string_view<char,std::char_traits<char>>&>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 keywordsMissingValue,&local_58);
    }
  }
  return;
}

Assistant:

void Instance::Consume(cm::string_view arg, void* result,
                       std::vector<std::string>* unparsedArguments,
                       std::vector<std::string>* keywordsMissingValue)
{
  auto const it = this->Bindings.Find(arg);
  if (it != this->Bindings.end()) {
    it->second(*this, result);
    if (this->ExpectValue && keywordsMissingValue != nullptr) {
      keywordsMissingValue->emplace_back(arg);
    }
    return;
  }

  if (this->CurrentString != nullptr) {
    this->CurrentString->assign(std::string(arg));
    this->CurrentString = nullptr;
    this->CurrentList = nullptr;
  } else if (this->CurrentList != nullptr) {
    this->CurrentList->emplace_back(arg);
  } else if (unparsedArguments != nullptr) {
    unparsedArguments->emplace_back(arg);
  }

  if (this->ExpectValue) {
    if (keywordsMissingValue != nullptr) {
      keywordsMissingValue->pop_back();
    }
    this->ExpectValue = false;
  }
}